

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *S,bool ShowColors,bool ShowKindLabel)

{
  string *psVar1;
  char *pcVar2;
  undefined8 *puVar3;
  byte bVar4;
  pointer ppVar5;
  uint uVar6;
  StringRef LineContents;
  StringRef LineContents_00;
  SMDiagnostic *pSVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  raw_ostream *prVar11;
  ulong uVar12;
  size_type sVar13;
  undefined7 in_register_00000009;
  uint *__n;
  uint *puVar14;
  char *pcVar15;
  byte *pbVar16;
  byte *pbVar17;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar18;
  void *__buf;
  size_t sVar19;
  void *__buf_00;
  void *__buf_01;
  ulong uVar20;
  undefined8 extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *extraout_RDX_06;
  byte *extraout_RDX_07;
  byte *extraout_RDX_08;
  byte *extraout_RDX_09;
  byte *pbVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  size_t i;
  byte *pbVar25;
  byte bVar26;
  long lVar27;
  size_t OutCol;
  ulong uVar28;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Chars;
  StringRef Text;
  string CaretLine;
  string FixItInsertionLine;
  byte *local_b8;
  byte *local_b0;
  ulong local_a8;
  long local_a0 [2];
  SMDiagnostic *local_90;
  long local_88;
  ulong local_80;
  undefined1 *local_78;
  byte *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  ulong local_58;
  size_type local_50;
  ulong local_48;
  StringRef local_40;
  
  __n = (uint *)CONCAT71(in_register_00000009,ShowColors);
  iVar8 = (*S->_vptr_raw_ostream[6])(S);
  bVar26 = (byte)iVar8 & ShowColors;
  if (bVar26 == 1) {
    __n = (uint *)0x0;
    (*S->_vptr_raw_ostream[2])(S,8,1);
  }
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    sVar10 = strlen(ProgName);
    Str.Length = sVar10;
    Str.Data = ProgName;
    prVar11 = raw_ostream::operator<<(S,Str);
    Str_00.Length = 2;
    Str_00.Data = ": ";
    raw_ostream::operator<<(prVar11,Str_00);
  }
  if ((this->Filename)._M_string_length != 0) {
    iVar8 = std::__cxx11::string::compare((char *)&this->Filename);
    if (iVar8 == 0) {
      Str_01.Length = 7;
      Str_01.Data = "<stdin>";
      raw_ostream::operator<<(S,Str_01);
      pvVar18 = extraout_RDX_00;
    }
    else {
      raw_ostream::write(S,(int)(this->Filename)._M_dataplus._M_p,
                         (void *)(this->Filename)._M_string_length,(size_t)__n);
      pvVar18 = extraout_RDX;
    }
    if (this->LineNo != -1) {
      pcVar24 = S->OutBufCur;
      if (pcVar24 < S->OutBufEnd) {
        __n = (uint *)(pcVar24 + 1);
        S->OutBufCur = (char *)__n;
        *pcVar24 = ':';
        prVar11 = S;
      }
      else {
        prVar11 = (raw_ostream *)raw_ostream::write(S,0x3a,pvVar18,(size_t)__n);
      }
      raw_ostream::operator<<(prVar11,(long)this->LineNo);
      if (this->ColumnNo != -1) {
        pcVar24 = S->OutBufCur;
        if (pcVar24 < S->OutBufEnd) {
          __n = (uint *)(pcVar24 + 1);
          S->OutBufCur = (char *)__n;
          *pcVar24 = ':';
          prVar11 = S;
        }
        else {
          prVar11 = (raw_ostream *)raw_ostream::write(S,0x3a,__buf,(size_t)__n);
        }
        raw_ostream::operator<<(prVar11,(long)this->ColumnNo + 1);
      }
    }
    Str_02.Length = 2;
    Str_02.Data = ": ";
    raw_ostream::operator<<(S,Str_02);
  }
  if (ShowKindLabel) {
    puVar14 = &switchD_0019f984::switchdataD_00209c38;
    switch(this->Kind) {
    case DK_Error:
      if (bVar26 != 0) {
        puVar14 = (uint *)0x0;
        (*S->_vptr_raw_ostream[2])(S,1,1);
      }
      pcVar24 = "error: ";
      sVar19 = 7;
      break;
    case DK_Warning:
      if (bVar26 != 0) {
        puVar14 = (uint *)0x0;
        (*S->_vptr_raw_ostream[2])(S,5,1);
      }
      pcVar24 = "warning: ";
      sVar19 = 9;
      break;
    case DK_Remark:
      if (bVar26 != 0) {
        puVar14 = (uint *)0x0;
        (*S->_vptr_raw_ostream[2])(S,4,1);
      }
      pcVar24 = "remark: ";
      sVar19 = 8;
      break;
    case DK_Note:
      if (bVar26 != 0) {
        puVar14 = (uint *)0x0;
        (*S->_vptr_raw_ostream[2])(S,0,1);
      }
      pcVar24 = "note: ";
      sVar19 = 6;
      break;
    default:
      goto switchD_0019f984_default;
    }
    Str_03.Length = sVar19;
    Str_03.Data = pcVar24;
    raw_ostream::operator<<(S,Str_03);
    __n = puVar14;
switchD_0019f984_default:
    if (bVar26 != 0) {
      (*S->_vptr_raw_ostream[3])(S);
      __n = (uint *)0x0;
      (*S->_vptr_raw_ostream[2])(S,8,1);
      goto LAB_0019fa4c;
    }
    prVar11 = (raw_ostream *)
              raw_ostream::write(S,(int)(this->Message)._M_dataplus._M_p,
                                 (void *)(this->Message)._M_string_length,(size_t)__n);
    pcVar24 = prVar11->OutBufCur;
    if (pcVar24 < prVar11->OutBufEnd) {
      prVar11->OutBufCur = pcVar24 + 1;
      *pcVar24 = '\n';
    }
    else {
      raw_ostream::write(prVar11,10,__buf_01,(size_t)pcVar24);
    }
  }
  else {
LAB_0019fa4c:
    prVar11 = (raw_ostream *)
              raw_ostream::write(S,(int)(this->Message)._M_dataplus._M_p,
                                 (void *)(this->Message)._M_string_length,(size_t)__n);
    pcVar24 = prVar11->OutBufCur;
    if (pcVar24 < prVar11->OutBufEnd) {
      prVar11->OutBufCur = pcVar24 + 1;
      *pcVar24 = '\n';
    }
    else {
      raw_ostream::write(prVar11,10,__buf_00,(size_t)pcVar24);
    }
    if (bVar26 != 0) {
      (*S->_vptr_raw_ostream[3])(S);
    }
  }
  if (this->LineNo == -1) {
    return;
  }
  if (this->ColumnNo == -1) {
    return;
  }
  psVar1 = &this->LineContents;
  pcVar24 = (psVar1->_M_dataplus)._M_p;
  local_58 = (this->LineContents)._M_string_length;
  LineContents.Data = (psVar1->_M_dataplus)._M_p;
  LineContents.Length = psVar1->_M_string_length;
  pcVar2 = pcVar24 + local_58;
  pcVar15 = pcVar24;
  if (0 < (long)local_58 >> 2) {
    pcVar15 = pcVar24 + (local_58 & 0xfffffffffffffffc);
    lVar22 = ((long)local_58 >> 2) + 1;
    pcVar24 = pcVar24 + 3;
    do {
      if (pcVar24[-3] < '\0') {
        pcVar24 = pcVar24 + -3;
        goto LAB_0019fb74;
      }
      if (pcVar24[-2] < '\0') {
        pcVar24 = pcVar24 + -2;
        goto LAB_0019fb74;
      }
      if (pcVar24[-1] < '\0') {
        pcVar24 = pcVar24 + -1;
        goto LAB_0019fb74;
      }
      if (*pcVar24 < '\0') goto LAB_0019fb74;
      lVar22 = lVar22 + -1;
      pcVar24 = pcVar24 + 4;
    } while (1 < lVar22);
  }
  lVar22 = (long)pcVar2 - (long)pcVar15;
  if (lVar22 != 1) {
    if (lVar22 != 2) {
      pcVar24 = pcVar2;
      if ((lVar22 != 3) || (pcVar24 = pcVar15, *pcVar15 < '\0')) goto LAB_0019fb74;
      pcVar15 = pcVar15 + 1;
    }
    pcVar24 = pcVar15;
    if (*pcVar15 < '\0') goto LAB_0019fb74;
    pcVar15 = pcVar15 + 1;
  }
  pcVar24 = pcVar15;
  if (-1 < *pcVar15) {
    pcVar24 = pcVar2;
  }
LAB_0019fb74:
  if (pcVar24 != pcVar2) {
    printSourceLine(S,LineContents);
    return;
  }
  local_b0 = (byte *)local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)local_58 + '\x01');
  uVar12 = (ulong)((long)(this->Ranges).
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Ranges).
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar12 != 0) {
    uVar28 = 0;
    do {
      ppVar5 = (this->Ranges).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)ppVar5[uVar28].first;
      uVar20 = (ulong)ppVar5[uVar28].second;
      if (local_a8 < uVar20) {
        uVar20 = local_a8;
      }
      sVar10 = uVar20 - uVar23;
      if (sVar10 != 0) {
        memset(local_b0 + uVar23,0x7e,sVar10);
      }
      uVar28 = uVar28 + 1;
    } while ((uVar12 & 0xffffffff) != uVar28);
  }
  local_78 = &local_68;
  local_70 = (byte *)0x0;
  local_68 = 0;
  uVar12 = (ulong)(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  local_90 = this;
  if (uVar12 != 0) {
    uVar28 = (long)(this->Loc).Ptr - (long)this->ColumnNo;
    local_50 = (this->LineContents)._M_string_length;
    pvVar18 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
              super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
              super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    local_80 = local_50 + uVar28;
    lVar22 = uVar12 * 0x30;
    lVar27 = 0;
    local_b8 = (byte *)0x0;
    local_88 = lVar22;
    local_48 = uVar28;
    do {
      puVar3 = (undefined8 *)((long)pvVar18 + lVar27 + 0x10);
      local_40.Data = (char *)*puVar3;
      local_40.Length = puVar3[1];
      Chars.Length = 3;
      Chars.Data = "\n\r\t";
      sVar13 = StringRef::find_first_of(&local_40,Chars,0);
      if (sVar13 == 0xffffffffffffffff) {
        uVar12 = *(ulong *)((long)pvVar18 + lVar27);
        uVar20 = *(ulong *)((long)pvVar18 + lVar27 + 8);
        Text.Length._1_7_ = (undefined7)((ulong)extraout_RDX_01 >> 8);
        Text.Length._0_1_ = uVar20 < uVar28 || local_80 < uVar12;
        if (uVar20 >= uVar28 && local_80 >= uVar12) {
          uVar9 = (int)uVar12 - (int)uVar28;
          if (uVar12 < uVar28) {
            uVar9 = 0;
          }
          pbVar21 = (byte *)(ulong)uVar9;
          Text.Data = *(char **)((long)pvVar18 + lVar27 + 0x18);
          iVar8 = sys::locale::columnWidth(*(locale **)((long)pvVar18 + lVar27 + 0x10),Text);
          lVar22 = *(long *)((long)pvVar18 + lVar27 + 0x18);
          if (lVar22 != iVar8) {
            __assert_fail("(size_t)sys::locale::columnWidth(I->getText()) == I->getText().size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                          ,0x141,
                          "void buildFixItLine(std::string &, std::string &, ArrayRef<SMFixIt>, ArrayRef<char>)"
                         );
          }
          uVar6 = (int)local_b8 + 1;
          if (local_b8 <= pbVar21) {
            uVar6 = uVar9;
          }
          uVar9 = (int)lVar22 + uVar6;
          local_b8 = (byte *)(ulong)uVar9;
          if (local_70 < local_b8) {
            std::__cxx11::string::resize((ulong)&local_78,(char)uVar9);
          }
          sVar10 = *(size_t *)((long)pvVar18 + lVar27 + 0x18);
          if (sVar10 != 0) {
            memmove(local_78 + uVar6,*(void **)((long)pvVar18 + lVar27 + 0x10),sVar10);
          }
          uVar28 = local_48;
          uVar9 = (int)uVar20 - (int)local_48;
          if (local_80 <= uVar20) {
            uVar9 = (uint)local_50;
          }
          lVar22 = local_88;
          if ((ulong)uVar9 - (long)pbVar21 != 0) {
            memset(local_b0 + (long)pbVar21,0x7e,(ulong)uVar9 - (long)pbVar21);
            lVar22 = local_88;
          }
        }
      }
      lVar27 = lVar27 + 0x30;
    } while (lVar22 != lVar27);
  }
  pSVar7 = local_90;
  uVar12 = (long)local_90->ColumnNo;
  if (local_58 < (uint)local_90->ColumnNo) {
    uVar12 = local_58;
  }
  local_b0[uVar12] = 0x5e;
  lVar22 = std::__cxx11::string::find_last_not_of((char)&local_b0,0x20);
  uVar12 = lVar22 + 1;
  if (uVar12 <= local_a8) {
    local_b0[uVar12] = 0;
    LineContents_00.Data = (pSVar7->LineContents)._M_dataplus._M_p;
    LineContents_00.Length = (pSVar7->LineContents)._M_string_length;
    pbVar16 = local_b0;
    local_a8 = uVar12;
    printSourceLine(S,LineContents_00);
    pbVar21 = extraout_RDX_02;
    if (bVar26 != 0) {
      pbVar16 = (byte *)0x0;
      (*S->_vptr_raw_ostream[2])(S,2,1);
      pbVar21 = extraout_RDX_03;
    }
    uVar12 = local_a8 & 0xffffffff;
    if (uVar12 != 0) {
      uVar28 = 0;
      uVar9 = 0;
      do {
        if ((uVar28 < (pSVar7->LineContents)._M_string_length) &&
           ((pSVar7->LineContents)._M_dataplus._M_p[uVar28] == '\t')) {
          do {
            bVar4 = local_b0[uVar28];
            pbVar16 = (byte *)S->OutBufCur;
            if (pbVar16 < S->OutBufEnd) {
              pbVar21 = pbVar16 + 1;
              S->OutBufCur = (char *)pbVar21;
              *pbVar16 = bVar4;
            }
            else {
              raw_ostream::write(S,(uint)bVar4,pbVar21,(size_t)pbVar16);
              pbVar21 = extraout_RDX_04;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar9 & 7) != 0);
        }
        else {
          bVar4 = local_b0[uVar28];
          pbVar16 = (byte *)S->OutBufCur;
          if (pbVar16 < S->OutBufEnd) {
            pbVar21 = pbVar16 + 1;
            S->OutBufCur = (char *)pbVar21;
            *pbVar16 = bVar4;
          }
          else {
            raw_ostream::write(S,(uint)bVar4,pbVar21,(size_t)pbVar16);
            pbVar21 = extraout_RDX_05;
          }
          uVar9 = uVar9 + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar12);
    }
    pcVar24 = S->OutBufCur;
    if (pcVar24 < S->OutBufEnd) {
      S->OutBufCur = pcVar24 + 1;
      *pcVar24 = '\n';
    }
    else {
      raw_ostream::write(S,10,pbVar21,(size_t)pbVar16);
      pbVar21 = extraout_RDX_06;
    }
    if (bVar26 != 0) {
      (*S->_vptr_raw_ostream[3])(S);
      pbVar21 = extraout_RDX_07;
    }
    pbVar16 = local_70;
    if (local_70 != (byte *)0x0) {
      uVar12 = 0;
      pbVar25 = (byte *)0x0;
      do {
        if ((pbVar25 < (byte *)(pSVar7->LineContents)._M_string_length) &&
           ((pSVar7->LineContents)._M_dataplus._M_p[(long)pbVar25] == '\t')) {
          do {
            bVar26 = local_78[(long)pbVar25];
            pbVar17 = (byte *)S->OutBufCur;
            if (pbVar17 < S->OutBufEnd) {
              pbVar21 = pbVar17 + 1;
              S->OutBufCur = (char *)pbVar21;
              *pbVar17 = bVar26;
            }
            else {
              raw_ostream::write(S,(uint)bVar26,pbVar21,(size_t)pbVar17);
              pbVar21 = extraout_RDX_08;
            }
            pbVar17 = (byte *)(ulong)(local_78[(long)pbVar25] != ' ');
            pbVar25 = pbVar25 + (long)pbVar17;
            uVar12 = uVar12 + 1;
          } while (((uVar12 & 7) != 0) && (pbVar25 != pbVar16));
        }
        else {
          bVar26 = local_78[(long)pbVar25];
          pbVar17 = (byte *)S->OutBufCur;
          if (pbVar17 < S->OutBufEnd) {
            pbVar21 = pbVar17 + 1;
            S->OutBufCur = (char *)pbVar21;
            *pbVar17 = bVar26;
          }
          else {
            raw_ostream::write(S,(uint)bVar26,pbVar21,(size_t)pbVar17);
            pbVar21 = extraout_RDX_09;
          }
          uVar12 = uVar12 + 1;
        }
        pbVar25 = pbVar25 + 1;
      } while (pbVar25 < pbVar16);
      pcVar24 = S->OutBufCur;
      if (pcVar24 < S->OutBufEnd) {
        S->OutBufCur = pcVar24 + 1;
        *pcVar24 = '\n';
      }
      else {
        raw_ostream::write(S,10,pbVar21,(size_t)pbVar17);
      }
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    if (local_b0 != (byte *)local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar12);
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &S, bool ShowColors,
                         bool ShowKindLabel) const {
  // Display colors only if OS supports colors.
  ShowColors &= S.has_colors();

  if (ShowColors)
    S.changeColor(raw_ostream::SAVEDCOLOR, true);

  if (ProgName && ProgName[0])
    S << ProgName << ": ";

  if (!Filename.empty()) {
    if (Filename == "-")
      S << "<stdin>";
    else
      S << Filename;

    if (LineNo != -1) {
      S << ':' << LineNo;
      if (ColumnNo != -1)
        S << ':' << (ColumnNo+1);
    }
    S << ": ";
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      if (ShowColors)
        S.changeColor(raw_ostream::RED, true);
      S << "error: ";
      break;
    case SourceMgr::DK_Warning:
      if (ShowColors)
        S.changeColor(raw_ostream::MAGENTA, true);
      S << "warning: ";
      break;
    case SourceMgr::DK_Note:
      if (ShowColors)
        S.changeColor(raw_ostream::BLACK, true);
      S << "note: ";
      break;
    case SourceMgr::DK_Remark:
      if (ShowColors)
        S.changeColor(raw_ostream::BLUE, true);
      S << "remark: ";
      break;
    }

    if (ShowColors) {
      S.resetColor();
      S.changeColor(raw_ostream::SAVEDCOLOR, true);
    }
  }

  S << Message << '\n';

  if (ShowColors)
    S.resetColor();

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(S, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(S, LineContents);

  if (ShowColors)
    S.changeColor(raw_ostream::GREEN, true);

  // Print out the caret line, matching tabs in the source line.
  for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << CaretLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << CaretLine[i];
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';

  if (ShowColors)
    S.resetColor();

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  S << '\n';
}